

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

t_symbol * stlook(int flag)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int hash;
  int sym_flag;
  t_symbol *sym;
  int flag_local;
  
  bVar3 = false;
  if ((symbol[1] == '.') || (symbol[1] == '@')) {
    if (glablptr == (t_symbol *)0x0) {
      error("Local symbol not allowed here!");
      return (t_symbol *)0x0;
    }
    _hash = glablptr->local;
    while ((_hash != (t_symbol *)0x0 && (iVar1 = strcmp(symbol,_hash->name), iVar1 != 0))) {
      _hash = _hash->next;
    }
    if ((_hash == (t_symbol *)0x0) && (bVar3 = flag != 0, bVar3)) {
      _hash = stinstall(0,1);
    }
  }
  else {
    iVar1 = symhash();
    _hash = hash_tbl[iVar1];
    while ((_hash != (t_symbol *)0x0 && (iVar2 = strcmp(symbol,_hash->name), iVar2 != 0))) {
      _hash = _hash->next;
    }
    if ((_hash == (t_symbol *)0x0) && (bVar3 = flag != 0, bVar3)) {
      _hash = stinstall(iVar1,0);
    }
  }
  if ((!bVar3) && (_hash != (t_symbol *)0x0)) {
    _hash->refcnt = _hash->refcnt + 1;
  }
  return _hash;
}

Assistant:

struct t_symbol *stlook(int flag)
{
	struct t_symbol *sym;
	int sym_flag = 0;
	int hash;

	/* local symbol */
	if (symbol[1] == '.' || symbol[1] == '@') {
		if (glablptr) {
			/* search the symbol in the local list */
			sym = glablptr->local;

			while (sym) {
				if (!strcmp(symbol, sym->name))
					break;
				sym = sym->next;
			}

			/* new symbol */
			if (sym == NULL) {
				if (flag) {
					sym = stinstall(0, 1);
					sym_flag = 1;
				}
			}
		}
		else {
			error("Local symbol not allowed here!");
			return (NULL);
		}
	}

	/* global symbol */
	else {
		/* search symbol */
		hash = symhash();
		sym  = hash_tbl[hash];
		while (sym) {
			if (!strcmp(symbol, sym->name))
				break;
			sym = sym->next;
		}

		/* new symbol */
		if (sym == NULL) {
			if (flag) {
				sym = stinstall(hash, 0);
				sym_flag = 1;
			}
		}
	}

	/* incremente symbol reference counter */
	if (sym_flag == 0) {
		if (sym)
			sym->refcnt++;
	}

	/* ok */
	return (sym);
}